

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

nn_transport * nn_global_transport(int id)

{
  nn_transport *pnVar1;
  nn_transport **ppnVar2;
  
  if (nn_transports[0] != (nn_transport *)0x0) {
    ppnVar2 = nn_transports;
    pnVar1 = nn_transports[0];
    do {
      ppnVar2 = ppnVar2 + 1;
      if (pnVar1->id == id) {
        return pnVar1;
      }
      pnVar1 = *ppnVar2;
    } while (pnVar1 != (nn_transport *)0x0);
  }
  return (nn_transport *)0x0;
}

Assistant:

const struct nn_transport *nn_global_transport (int id)
{
    const struct nn_transport *tp;
    int i;

    for (i = 0; (tp = nn_transports[i]) != NULL; i++) {
        if (tp->id == id)
            return tp;
    }
    return NULL;
}